

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
          (ConfidentialTxOutReference *this,ConfidentialTxOutReference *param_1)

{
  bool bVar1;
  undefined7 uVar2;
  
  (this->super_AbstractTxOutReference)._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__AbstractTxOutReference_00723740;
  bVar1 = (param_1->super_AbstractTxOutReference).value_.ignore_check_;
  uVar2 = *(undefined7 *)&(param_1->super_AbstractTxOutReference).value_.field_0x9;
  (this->super_AbstractTxOutReference).value_.amount_ =
       (param_1->super_AbstractTxOutReference).value_.amount_;
  (this->super_AbstractTxOutReference).value_.ignore_check_ = bVar1;
  *(undefined7 *)&(this->super_AbstractTxOutReference).value_.field_0x9 = uVar2;
  Script::Script(&(this->super_AbstractTxOutReference).locking_script_,
                 &(param_1->super_AbstractTxOutReference).locking_script_);
  (this->super_AbstractTxOutReference)._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialTxOutReference_007236c8;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,&param_1->asset_);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,&param_1->confidential_value_);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_,&param_1->nonce_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->surjection_proof_,
             &(param_1->surjection_proof_).data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->range_proof_,
             &(param_1->range_proof_).data_);
  return;
}

Assistant:

class CFD_CORE_EXPORT ConfidentialTxOutReference
    : public AbstractTxOutReference {
 public:
  /**
   * @brief constructor
   * @param[in] tx_out            Confidential Transaction's TxOut.
   */
  explicit ConfidentialTxOutReference(const ConfidentialTxOut& tx_out);
  /**
   * @brief default constructor.
   */
  ConfidentialTxOutReference()
      : ConfidentialTxOutReference(ConfidentialTxOut()) {
    // do nothing
  }
  /**
   * @brief destructor
   */
  virtual ~ConfidentialTxOutReference() {
    // do nothing
  }

  /**
   * @brief Get asset
   * @return asset
   */
  ConfidentialAssetId GetAsset() const { return asset_; }

  /**
   * @brief Get confidential value
   * @return confidential value
   */
  ConfidentialValue GetConfidentialValue() const {
    return confidential_value_;
  }

  /**
   * @brief Get nonce
   * @return nonce
   */
  ConfidentialNonce GetNonce() const { return nonce_; }

  /**
   * @brief Get surjection proof
   * @return surjection proof
   */
  ByteData GetSurjectionProof() const { return surjection_proof_; }

  /**
   * @brief Get range proof
   * @return range proof
   */
  ByteData GetRangeProof() const { return range_proof_; }
  /**
   * @brief Get a serialized size.
   * @param[in] is_blinded             blinding or not.
   * @param[out] witness_area_size     witness area size.
   * @param[out] no_witness_area_size  no witness area size.
   * @param[in] exponent               rangeproof exponent value.
   *   -1 to 18. -1 is public value. 0 is most private.
   * @param[in] minimum_bits           rangeproof blinding bits.
   *   0 to 64. Number of bits of the value to keep private. 0 is auto.
   * @param[in,out] rangeproof_size    rangeproof size.
   *   0 is calclate from exponent and minimum bits. not 0 is using value.
   * @param[in] input_asset_count      tx input asset count. (contain issuance)
   * @return serialized size
   */
  uint32_t GetSerializeSize(
      bool is_blinded = true, uint32_t* witness_area_size = nullptr,
      uint32_t* no_witness_area_size = nullptr, int exponent = 0,
      int minimum_bits = kDefaultBlindMinimumBits,
      uint32_t* rangeproof_size = nullptr,
      uint32_t input_asset_count = 0) const;

  /**
   * @brief Get a serialized virtual size.
   * @param[in] is_blinded             blinding or not.
   * @param[in] exponent               rangeproof exponent value.
   *   -1 to 18. -1 is public value. 0 is most private.
   * @param[in] minimum_bits           rangeproof blinding bits.
   *   0 to 64. Number of bits of the value to keep private. 0 is auto.
   * @param[in,out] rangeproof_size    rangeproof size.
   *   0 is calclate from exponent and minimum bits. not 0 is using value.
   * @param[in] input_asset_count      tx input asset count. (contain issuance)
   * @return serialized virtual size.
   */
  uint32_t GetSerializeVsize(
      bool is_blinded = true, int exponent = 0,
      int minimum_bits = kDefaultBlindMinimumBits,
      uint32_t* rangeproof_size = nullptr,
      uint32_t input_asset_count = 0) const;

 private:
  ConfidentialAssetId asset_;             //!< confidential asset
  ConfidentialValue confidential_value_;  //!< confidential value.
  ConfidentialNonce nonce_;               //!< nonce
  ByteData surjection_proof_;             //!< surjection proof
  ByteData range_proof_;                  //!< range proof
}